

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O1

void __thiscall Colour::Colour(Colour *this,string *name,float r,float g,float b)

{
  GLfloat *pGVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->r = (int)(r * 255.0);
  this->g = (int)(g * 255.0);
  this->b = (int)(b * 255.0);
  pGVar1 = (GLfloat *)operator_new__(0xc);
  this->colour = pGVar1;
  *pGVar1 = r;
  pGVar1[1] = g;
  pGVar1[2] = b;
  std::__cxx11::string::_M_assign((string *)&this->name);
  return;
}

Assistant:

Colour::Colour(const string& name, float r, float g, float b) {
    this->r = r*255;
    this->g = g*255;
    this->b = b*255;
    
    colour = new GLfloat[3];
    this->colour[0] = r;
    this->colour[1] = g;
    this->colour[2] = b;

    this->name = name;
}